

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

void __thiscall
ImVector<ImGuiKeyRoutingData>::push_back(ImVector<ImGuiKeyRoutingData> *this,ImGuiKeyRoutingData *v)

{
  ImGuiKeyRoutingData *pIVar1;
  ImU16 IVar2;
  ImU8 IVar3;
  undefined3 uVar4;
  ImGuiID IVar5;
  ImGuiID IVar6;
  int iVar7;
  int iVar8;
  int new_capacity;
  
  iVar8 = this->Size;
  if (iVar8 == this->Capacity) {
    if (iVar8 == 0) {
      iVar7 = 8;
    }
    else {
      iVar7 = iVar8 / 2 + iVar8;
    }
    new_capacity = iVar8 + 1;
    if (iVar8 + 1 < iVar7) {
      new_capacity = iVar7;
    }
    reserve(this,new_capacity);
    iVar8 = this->Size;
  }
  IVar2 = v->Mods;
  IVar3 = v->RoutingNextScore;
  uVar4 = *(undefined3 *)&v->field_0x5;
  IVar5 = v->RoutingCurr;
  IVar6 = v->RoutingNext;
  pIVar1 = this->Data + iVar8;
  pIVar1->NextEntryIndex = v->NextEntryIndex;
  pIVar1->Mods = IVar2;
  pIVar1->RoutingNextScore = IVar3;
  *(undefined3 *)&pIVar1->field_0x5 = uVar4;
  pIVar1->RoutingCurr = IVar5;
  pIVar1->RoutingNext = IVar6;
  this->Size = this->Size + 1;
  return;
}

Assistant:

inline void         push_back(const T& v)               { if (Size == Capacity) reserve(_grow_capacity(Size + 1)); memcpy(&Data[Size], &v, sizeof(v)); Size++; }